

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

int zt_hexdump_default_printer(void *ctx,size_t addr,char *hex,char *txt)

{
  int iVar1;
  long lVar2;
  undefined8 in_RCX;
  long in_RDX;
  ulong in_RSI;
  long lVar3;
  char buffer [101];
  size_t base;
  size_t offt;
  char local_98 [104];
  long local_30;
  long local_28;
  undefined8 local_20;
  
  local_30 = 0x37;
  if (in_RDX == 0) {
    printf("\n");
  }
  else {
    local_20 = in_RCX;
    if (in_RSI < 0xffff) {
      lVar3 = in_RDX + 0x18;
      lVar2 = in_RDX + 0x24;
      iVar1 = snprintf(local_98,100,"%.4zX   %.12s %.12s %.12s %.12s",in_RSI,in_RDX,in_RDX + 0xc,
                       lVar3,lVar2);
      local_30 = local_30 + 4;
    }
    else if (in_RSI < 0xffffffff) {
      lVar3 = in_RDX + 0x18;
      lVar2 = in_RDX + 0x24;
      iVar1 = snprintf(local_98,100,"%.8zX   %.12s %.12s %.12s %.12s",in_RSI,in_RDX,in_RDX + 0xc,
                       lVar3,lVar2);
      local_30 = local_30 + 8;
    }
    else {
      lVar3 = in_RDX + 0x18;
      lVar2 = in_RDX + 0x24;
      iVar1 = snprintf(local_98,100,"%.16zX   %.12s %.12s %.12s %.12s",in_RSI,in_RDX,in_RDX + 0xc,
                       lVar3,lVar2);
      local_30 = local_30 + 0x10;
    }
    local_28 = (long)iVar1;
    snprintf(local_98 + local_28,100 - local_28,"%*s| %s",local_30 - local_28 & 0xffffffff,"",
             local_20,lVar3,lVar2);
    printf("%s\n",local_98);
  }
  return 0;
}

Assistant:

int
zt_hexdump_default_printer(UNUSED void * ctx, size_t addr, char * hex, char * txt) {
    size_t    offt;
    size_t    base = 55;
    char      buffer[100+1];

    if (hex) {
        if (addr < 65535) {
            offt = snprintf(buffer, 100, "%.4zX   %.12s %.12s %.12s %.12s", addr, hex, hex+(4*3), hex+(8*3), hex+(12*3));
            base += 4;
        } else if (addr < 4294967295UL) {
            offt = snprintf(buffer, 100, "%.8zX   %.12s %.12s %.12s %.12s", addr, hex, hex+(4*3), hex+(8*3), hex+(12*3));
            base += 8;
        } else {
            offt = snprintf(buffer, 100, "%.16zX   %.12s %.12s %.12s %.12s", addr, hex, hex+(4*3), hex+(8*3), hex+(12*3));
            base += 16;
        }

        snprintf(buffer+offt, 100-offt, BLANK "| %s", INDENT_TO(base, 1, offt), txt);
        printf("%s\n", buffer);
    } else {
        printf("\n");
    }
    return 0;
}